

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O2

void __thiscall
Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
TypeRecipient<Sinclair::ZX::Keyboard::Machine>
          (TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *this,Machine *args)

{
  (this->super_Delegate).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0058af58;
  (this->typer_)._M_t.super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>.
  _M_t.super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->previous_typer_)._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  Sinclair::ZX::Keyboard::CharacterMapper::CharacterMapper(&this->character_mapper,*args);
  return;
}

Assistant:

TypeRecipient(Args&&... args) : character_mapper(std::forward<Args>(args)...) {}